

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O1

int mod2dense_equal(mod2dense *m1,mod2dense *m2)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  FILE *pFVar12;
  FILE *pFVar13;
  mod2entry *extraout_RAX;
  mod2entry *pmVar14;
  size_t sVar15;
  byte bVar16;
  FILE *pFVar17;
  long extraout_RDX;
  ulong uVar18;
  long extraout_RDX_00;
  FILE *unaff_RBX;
  uint uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  FILE *pFVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iStack_16c;
  FILE *pFStack_168;
  FILE *pFStack_160;
  code *pcStack_158;
  FILE *pFStack_148;
  FILE *pFStack_140;
  ulong uStack_138;
  long lStack_a0;
  uint uStack_98;
  int iStack_94;
  
  uVar9 = m1->n_rows;
  uVar10 = (ulong)uVar9;
  if (uVar9 == m2->n_rows) {
    uVar2 = m1->n_cols;
    if (uVar2 == m2->n_cols) {
      if (0 < (int)uVar2) {
        uVar10 = (ulong)(m1->n_words - 1);
        uVar23 = 0;
        do {
          if (m1->n_words < 2) {
            uVar22 = 0;
          }
          else {
            uVar25 = 0;
            do {
              if (m1->col[uVar23][uVar25] != m2->col[uVar23][uVar25]) {
                return 0;
              }
              uVar25 = uVar25 + 1;
              uVar22 = uVar10;
            } while (uVar10 != uVar25);
          }
          if (((m2->col[uVar23][uVar22] ^ m1->col[uVar23][uVar22]) & ~(-1 << ((byte)uVar9 & 0x1f)))
              != 0) {
            return 0;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar2);
      }
      return 1;
    }
  }
  mod2dense_equal_cold_1();
  uVar9 = ((FILE *)m1)->_flags;
  uVar23 = (ulong)uVar9;
  pFVar17 = (FILE *)m2;
  if (uVar9 == *(uint *)&((FILE *)m1)->field_0x4) {
    if (m2 != m1) {
      if ((((FILE *)m2)->_flags == uVar9) && (*(uint *)&((FILE *)m2)->field_0x4 == uVar9)) {
        uVar2 = *(uint *)&((FILE *)m1)->_IO_read_ptr;
        mod2dense_clear(m2);
        if (0 < (int)uVar9) {
          uVar19 = 0;
          do {
            mod2dense_set(m2,uVar19,uVar19,1);
            uVar19 = uVar19 + 1;
          } while (uVar9 != uVar19);
        }
        if (0 < (int)uVar9) {
          uVar10 = 0;
          do {
            uVar25 = uVar10 >> 5 & 0x7ffffff;
            bVar16 = (byte)uVar10 & 0x1f;
            uVar22 = uVar10;
            do {
              uVar24 = uVar22;
              if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar22 * 2)
                            + uVar25 * 4) & 1 << bVar16) != 0) break;
              uVar22 = uVar22 + 1;
              uVar24 = uVar23;
            } while (uVar23 != uVar22);
            if ((uint)uVar24 == uVar9) {
              return 0;
            }
            uVar24 = uVar24 & 0xffffffff;
            if (uVar10 != uVar24) {
              pmVar14 = (mod2entry *)((FILE *)m1)->_IO_read_end;
              uVar4 = *(undefined8 *)(&pmVar14->row + uVar10 * 2);
              *(undefined8 *)(&pmVar14->row + uVar10 * 2) =
                   *(undefined8 *)(&pmVar14->row + uVar24 * 2);
              *(undefined8 *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar24 * 2) = uVar4;
              pmVar14 = (mod2entry *)((FILE *)m2)->_IO_read_end;
              uVar4 = *(undefined8 *)(&pmVar14->row + uVar10 * 2);
              *(undefined8 *)(&pmVar14->row + uVar10 * 2) =
                   *(undefined8 *)(&pmVar14->row + uVar24 * 2);
              *(undefined8 *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row + uVar24 * 2) = uVar4;
            }
            uVar22 = 0;
            do {
              if (uVar22 != uVar10) {
                lVar11 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar22 * 2);
                if ((*(uint *)(lVar11 + uVar25 * 4) & 1 << bVar16) != 0) {
                  if ((int)uVar25 < (int)uVar2) {
                    lVar21 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar10 * 2)
                    ;
                    uVar24 = uVar10 >> 5;
                    do {
                      puVar1 = (uint *)(lVar11 + uVar24 * 4);
                      *puVar1 = *puVar1 ^ *(uint *)(lVar21 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while ((uVar2 + (int)(uVar10 >> 5)) - (int)uVar25 != uVar24);
                  }
                  if (0 < (int)uVar2) {
                    lVar11 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row + uVar22 * 2)
                    ;
                    lVar21 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row + uVar10 * 2)
                    ;
                    uVar24 = 0;
                    do {
                      puVar1 = (uint *)(lVar11 + uVar24 * 4);
                      *puVar1 = *puVar1 ^ *(uint *)(lVar21 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar2 != uVar24);
                  }
                }
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar23);
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar23);
        }
        return 1;
      }
      mod2dense_invert_cold_2();
      unaff_RBX = (FILE *)m2;
      goto LAB_001248f0;
    }
  }
  else {
LAB_001248f0:
    m2 = (mod2dense *)unaff_RBX;
    mod2dense_invert_cold_1();
  }
  mod2dense_invert_cold_3();
  if (pFVar17 != (FILE *)m1) {
    iVar8 = ((FILE *)m1)->_flags;
    lVar11 = (long)iVar8;
    if (pFVar17->_flags == iVar8) {
      uVar9 = *(uint *)&((FILE *)m1)->field_0x4;
      uVar22 = (ulong)uVar9;
      if (*(uint *)&pFVar17->field_0x4 == uVar9) {
        uVar2 = *(uint *)&((FILE *)m1)->_IO_read_ptr;
        uVar23 = (ulong)uVar2;
        mod2dense_clear((mod2dense *)pFVar17);
        auVar6 = _DAT_001290f0;
        if (0 < iVar8) {
          lVar21 = lVar11 + -1;
          auVar27._8_4_ = (int)lVar21;
          auVar27._0_8_ = lVar21;
          auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar25 = 0;
          auVar27 = auVar27 ^ _DAT_001290f0;
          auVar28 = _DAT_001290e0;
          do {
            auVar29 = auVar28 ^ auVar6;
            if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                        auVar27._4_4_ < auVar29._4_4_) & 1)) {
              *(int *)(extraout_RDX + uVar25 * 4) = (int)uVar25;
            }
            if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
                auVar29._12_4_ <= auVar27._12_4_) {
              *(int *)(extraout_RDX + 4 + uVar25 * 4) = (int)uVar25 + 1;
            }
            uVar25 = uVar25 + 2;
            lVar21 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 2;
            auVar28._8_8_ = lVar21 + 2;
          } while ((iVar8 + 1U & 0xfffffffe) != uVar25);
        }
        if ((int)uVar9 < 1) {
          uVar25 = 0;
        }
        else {
          uVar25 = 0;
          do {
            *(int *)(uVar10 + uVar25 * 4) = (int)uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar22 != uVar25);
        }
        lStack_a0 = 0;
        uVar24 = 0;
        do {
          uVar19 = iVar8 - (int)lStack_a0;
          uVar18 = (ulong)uVar19;
          if ((long)uVar24 < (long)(int)uVar19) {
            lStack_a0 = (long)(int)lStack_a0;
            do {
              uVar19 = *(uint *)(extraout_RDX + uVar24 * 4);
              iStack_94 = (int)uVar19 >> 5;
              uStack_98 = uVar19 & 0x1f;
              uVar25 = uVar24;
              if ((long)uVar24 < (long)(int)uVar9) {
                do {
                  if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row +
                                          (long)*(int *)(uVar10 + uVar25 * 4) * 2) +
                                (long)iStack_94 * 4) & 1 << (sbyte)uStack_98) != 0)
                  goto LAB_00124ab9;
                  uVar25 = uVar25 + 1;
                } while (uVar22 != uVar25);
              }
              lStack_a0 = lStack_a0 + 1;
              *(undefined4 *)(extraout_RDX + uVar24 * 4) =
                   *(undefined4 *)(extraout_RDX + (lVar11 - lStack_a0) * 4);
              *(uint *)(extraout_RDX + (lVar11 - lStack_a0) * 4) = uVar19;
              uVar18 = lVar11 - lStack_a0;
            } while ((long)uVar24 < (long)uVar18);
          }
LAB_00124ab9:
          if (uVar24 == (uVar18 & 0xffffffff)) {
            if ((int)uVar18 < iVar8) {
              pmVar14 = (mod2entry *)pFVar17->_IO_read_end;
              lVar21 = (long)(int)uVar18;
              do {
                if (0 < (int)uVar2) {
                  memset(*(void **)(&pmVar14->row + (long)*(int *)(uVar10 + lVar21 * 4) * 2),0,
                         uVar23 * 4);
                }
                lVar21 = lVar21 + 1;
              } while (lVar11 != lVar21);
            }
            return (int)lStack_a0;
          }
          uVar19 = *(uint *)(uVar10 + (long)(int)uVar25 * 4);
          *(undefined4 *)(uVar10 + (long)(int)uVar25 * 4) = *(undefined4 *)(uVar10 + uVar24 * 4);
          *(uint *)(uVar10 + uVar24 * 4) = uVar19;
          mod2dense_set((mod2dense *)pFVar17,*(int *)(extraout_RDX + uVar24 * 4),uVar19,1);
          if ((int)uVar9 < 1) {
            uVar25 = 0;
          }
          else {
            uVar25 = 0;
            do {
              if (uVar25 != uVar19) {
                lVar21 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar25 * 2);
                if ((*(uint *)(lVar21 + (long)iStack_94 * 4) & 1 << ((byte)uStack_98 & 0x1f)) != 0)
                {
                  if (0 < (int)uVar2) {
                    lVar5 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row +
                                     (long)(int)uVar19 * 2);
                    uVar18 = 0;
                    do {
                      puVar1 = (uint *)(lVar21 + uVar18 * 4);
                      *puVar1 = *puVar1 ^ *(uint *)(lVar5 + uVar18 * 4);
                      uVar18 = uVar18 + 1;
                    } while (uVar23 != uVar18);
                  }
                  if (0 < (int)uVar2) {
                    lVar21 = *(long *)(&((mod2entry *)pFVar17->_IO_read_end)->row + uVar25 * 2);
                    lVar5 = *(long *)(&((mod2entry *)pFVar17->_IO_read_end)->row +
                                     (long)(int)uVar19 * 2);
                    uVar18 = 0;
                    do {
                      puVar1 = (uint *)(lVar21 + uVar18 * 4);
                      *puVar1 = *puVar1 ^ *(uint *)(lVar5 + uVar18 * 4);
                      uVar18 = uVar18 + 1;
                    } while (uVar23 != uVar18);
                  }
                }
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar22);
          }
          uVar24 = uVar24 + 1;
        } while( true );
      }
    }
    mod2dense_invert_selected_cold_1();
  }
  mod2dense_invert_selected_cold_2();
  uVar9 = ((FILE *)m1)->_flags;
  pFVar26 = (FILE *)(ulong)uVar9;
  if (uVar9 == *(uint *)&((FILE *)m1)->field_0x4) {
    if (pFVar17 == (FILE *)m1) goto LAB_00124e0b;
    if ((pFVar17->_flags == uVar9) && (*(uint *)&pFVar17->field_0x4 == uVar9)) {
      uVar2 = *(uint *)&((FILE *)m1)->_IO_read_ptr;
      mod2dense_clear((mod2dense *)pFVar17);
      if (0 < (int)uVar9) {
        uVar19 = 0;
        do {
          mod2dense_set((mod2dense *)pFVar17,uVar19,uVar19,1);
          uVar19 = uVar19 + 1;
        } while (uVar9 != uVar19);
      }
      if (0 < (int)uVar9) {
        pFVar12 = (FILE *)0x0;
        do {
          *(undefined4 *)(extraout_RDX_00 + (long)pFVar12 * 4) = 0xffffffff;
          *(int *)(uVar10 + (long)pFVar12 * 4) = (int)pFVar12;
          pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
        } while (pFVar26 != pFVar12);
      }
      if (0 < (int)uVar9) {
        pFVar12 = (FILE *)0x0;
        do {
          uVar19 = (uint)pFVar12;
          uVar23 = (ulong)pFVar12 >> 5 & 0x7ffffff;
          bVar16 = (byte)pFVar12 & 0x1f;
          pFVar13 = pFVar12;
          do {
            if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row +
                                    (long)pFVar13 * 2) + uVar23 * 4) & 1 << bVar16) != 0)
            goto LAB_00124cc8;
            pFVar13 = (FILE *)((long)&pFVar13->_flags + 1);
          } while (pFVar26 != pFVar13);
          pFVar13 = (FILE *)(ulong)uVar9;
LAB_00124cc8:
          uVar7 = (uint)pFVar13;
          if ((uint)pFVar13 == uVar9) {
            mod2dense_set(m1,uVar19,uVar19,1);
            *(uint *)(extraout_RDX_00 + (long)pFVar12 * 4) = uVar19;
            uVar7 = uVar19;
          }
          if (pFVar12 != (FILE *)(ulong)uVar7) {
            pmVar14 = (mod2entry *)((FILE *)m1)->_IO_read_end;
            uVar4 = *(undefined8 *)(&pmVar14->row + (long)pFVar12 * 2);
            lVar11 = (long)(int)uVar7;
            *(undefined8 *)(&pmVar14->row + (long)pFVar12 * 2) =
                 *(undefined8 *)(&pmVar14->row + lVar11 * 2);
            *(undefined8 *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + lVar11 * 2) = uVar4;
            pmVar14 = (mod2entry *)pFVar17->_IO_read_end;
            uVar4 = *(undefined8 *)(&pmVar14->row + (long)pFVar12 * 2);
            *(undefined8 *)(&pmVar14->row + (long)pFVar12 * 2) =
                 *(undefined8 *)(&pmVar14->row + lVar11 * 2);
            *(undefined8 *)(&((mod2entry *)pFVar17->_IO_read_end)->row + lVar11 * 2) = uVar4;
            uVar3 = *(undefined4 *)(uVar10 + (long)pFVar12 * 4);
            *(undefined4 *)(uVar10 + (long)pFVar12 * 4) = *(undefined4 *)(uVar10 + lVar11 * 4);
            *(undefined4 *)(uVar10 + lVar11 * 4) = uVar3;
          }
          pFVar13 = (FILE *)0x0;
          do {
            if (pFVar13 != pFVar12) {
              lVar11 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + (long)pFVar13 * 2
                                );
              if ((*(uint *)(lVar11 + uVar23 * 4) & 1 << bVar16) != 0) {
                if ((int)uVar23 < (int)uVar2) {
                  lVar21 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row +
                                    (long)pFVar12 * 2);
                  uVar22 = (ulong)pFVar12 >> 5;
                  do {
                    puVar1 = (uint *)(lVar11 + uVar22 * 4);
                    *puVar1 = *puVar1 ^ *(uint *)(lVar21 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while ((uVar2 + (int)((ulong)pFVar12 >> 5)) - (int)uVar23 != uVar22);
                }
                if (0 < (int)uVar2) {
                  lVar11 = *(long *)(&((mod2entry *)pFVar17->_IO_read_end)->row + (long)pFVar13 * 2)
                  ;
                  lVar21 = *(long *)(&((mod2entry *)pFVar17->_IO_read_end)->row + (long)pFVar12 * 2)
                  ;
                  uVar22 = 0;
                  do {
                    puVar1 = (uint *)(lVar11 + uVar22 * 4);
                    *puVar1 = *puVar1 ^ *(uint *)(lVar21 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar2 != uVar22);
                }
              }
            }
            pFVar13 = (FILE *)((long)&pFVar13->_flags + 1);
          } while (pFVar13 != pFVar26);
          pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
        } while (pFVar12 != pFVar26);
      }
      if ((int)uVar9 < 1) {
        iVar8 = 0;
      }
      else {
        pFVar17 = (FILE *)0x0;
        iVar8 = 0;
        do {
          iVar20 = *(int *)(extraout_RDX_00 + (long)pFVar17 * 4);
          if (iVar20 != -1) {
            *(int *)(extraout_RDX_00 + (long)iVar8 * 4) = iVar20;
            *(undefined4 *)(uVar10 + (long)iVar8 * 4) = *(undefined4 *)(uVar10 + (long)pFVar17 * 4);
            iVar8 = iVar8 + 1;
          }
          pFVar17 = (FILE *)((long)&pFVar17->_flags + 1);
        } while (pFVar26 != pFVar17);
      }
      return iVar8;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_00124e0b:
  mod2dense_forcibly_invert_cold_3();
  if ((((FILE *)m1)->_flags <= pFVar17->_flags) &&
     (m2 = (mod2dense *)pFVar17, pFVar26 = (FILE *)m1,
     *(int *)&((FILE *)m1)->field_0x4 <= *(int *)&pFVar17->field_0x4)) {
    mod2dense_clear((mod2dense *)pFVar17);
    iVar8 = extraout_EAX;
    if (0 < ((FILE *)m1)->_flags) {
      lVar11 = 0;
      do {
        for (pmVar14 = ((mod2entry *)((FILE *)m1)->_IO_read_ptr)[lVar11].right; -1 < pmVar14->row;
            pmVar14 = pmVar14->right) {
          mod2dense_set((mod2dense *)pFVar17,(int)lVar11,pmVar14->col,1);
        }
        lVar11 = lVar11 + 1;
        iVar8 = ((FILE *)m1)->_flags;
      } while (lVar11 < iVar8);
    }
    return iVar8;
  }
  mod2sparse_to_dense_cold_1();
  pFVar12 = (FILE *)m2;
  pFStack_148 = (FILE *)m2;
  pFStack_140 = pFVar26;
  uStack_138 = uVar23;
  if ((((FILE *)m1)->_flags <= pFVar17->_flags) &&
     (pFVar12 = pFVar17, pFVar26 = (FILE *)m1,
     *(int *)&((FILE *)m1)->field_0x4 <= *(int *)&pFVar17->field_0x4)) {
    pcStack_158 = (code *)0x124eac;
    mod2sparse_clear((mod2sparse *)pFVar17);
    iVar8 = (int)extraout_RAX;
    if (0 < ((FILE *)m1)->_flags) {
      iVar20 = 0;
      pmVar14 = extraout_RAX;
      do {
        if (0 < *(int *)&((FILE *)m1)->field_0x4) {
          iVar8 = 0;
          do {
            pcStack_158 = (code *)0x124ecb;
            uVar9 = mod2dense_get(m1,iVar20,iVar8);
            pmVar14 = (mod2entry *)(ulong)uVar9;
            if (uVar9 != 0) {
              pcStack_158 = (code *)0x124edc;
              pmVar14 = mod2sparse_insert((mod2sparse *)pFVar17,iVar20,iVar8);
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < *(int *)&((FILE *)m1)->field_0x4);
        }
        iVar8 = (int)pmVar14;
        iVar20 = iVar20 + 1;
      } while (iVar20 < ((FILE *)m1)->_flags);
    }
    return iVar8;
  }
  pcStack_158 = intio_read;
  mod2dense_to_sparse_cold_1();
  lVar11 = 0;
  pFStack_168 = pFVar12;
  pFStack_160 = pFVar26;
  pcStack_158 = (code *)uVar23;
  do {
    sVar15 = fread((void *)((long)&iStack_16c + lVar11),1,1,(FILE *)m1);
    if (sVar15 != 1) {
      return 0;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  return iStack_16c;
}

Assistant:

int mod2dense_equal
( mod2dense *m1,
  mod2dense *m2
)
{
  int k, j, w;
  mod2word m;

  if (mod2dense_rows(m1)!=mod2dense_rows(m2) 
   || mod2dense_cols(m1)!=mod2dense_cols(m2))
  { fprintf(stderr,"mod2dense_equal: Matrices have different dimensions\n");
    exit(1);
  }

  w = m1->n_words;

  /* Form a mask that has 1s in the lower bit positions corresponding to
     bits that contain information in the last word of a matrix column. */

  m = (1 << (mod2_wordsize - (w*mod2_wordsize-m1->n_rows))) - 1;
  
  for (j = 0; j<mod2dense_cols(m1); j++)
  {
    for (k = 0; k<w-1; k++)
    { if (m1->col[j][k] != m2->col[j][k]) return 0;
    }

    if ((m1->col[j][k]&m) != (m2->col[j][k]&m)) return 0;
  }

  return 1;
}